

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O3

void mh_assoc_resize(mh_assoc_t *h,void *arg)

{
  uint uVar1;
  mh_assoc_t *pmVar2;
  assoc_val **ppaVar3;
  mh_int_t *pmVar4;
  assoc_val **ppaVar5;
  assoc_val *paVar6;
  mh_int_t mVar7;
  mh_int_t mVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  mh_int_t mVar14;
  int iVar15;
  sbyte sVar16;
  ulong uVar18;
  uint *puVar19;
  ulong uVar20;
  bool bVar21;
  uint uVar17;
  
  pmVar2 = h->shadow;
  uVar9 = h->n_buckets;
  uVar20 = (ulong)h->resize_position;
  if (h->resize_position < uVar9) {
    mVar14 = h->batch;
    do {
      bVar21 = mVar14 == 0;
      mVar14 = mVar14 - 1;
      if (bVar21) {
        h->resize_position = (uint)uVar20;
        return;
      }
      if ((h->b[uVar20 >> 4] >> ((uint)uVar20 & 0xf) & 1) != 0) {
        ppaVar3 = h->p;
        uVar10 = PMurHash32(0xd,(ppaVar3[uVar20]->key).id,(ppaVar3[uVar20]->key).id_len);
        uVar9 = pmVar2->n_buckets;
        uVar18 = (ulong)uVar10 % (ulong)uVar9;
        iVar15 = uVar10 % (uVar9 - 1) + 1;
        pmVar4 = pmVar2->b;
        uVar12 = pmVar4[uVar18 >> 4];
        uVar17 = (uint)uVar18 & 0xf;
        sVar16 = (sbyte)uVar17;
        if ((uVar12 >> uVar17 & 1) != 0) {
          puVar19 = pmVar4 + (uVar18 >> 4);
          ppaVar5 = pmVar2->p;
          paVar6 = ppaVar3[uVar20];
          do {
            uVar9 = (paVar6->key).id_len;
            if ((uVar9 == (ppaVar5[uVar18]->key).id_len) &&
               (iVar11 = bcmp((paVar6->key).id,(ppaVar5[uVar18]->key).id,(ulong)uVar9), iVar11 == 0)
               ) goto LAB_0011470c;
            *puVar19 = uVar12 | 0x10000 << (sbyte)uVar17;
            uVar9 = pmVar2->n_buckets;
            uVar17 = (int)uVar18 + iVar15;
            uVar12 = uVar9;
            if (uVar17 < uVar9) {
              uVar12 = 0;
            }
            uVar17 = uVar17 - uVar12;
            uVar18 = (ulong)uVar17;
            puVar19 = pmVar4 + (uVar17 >> 4);
            uVar12 = *puVar19;
            uVar17 = uVar17 & 0xf;
            sVar16 = (sbyte)uVar17;
          } while ((uVar12 >> uVar17 & 1) != 0);
        }
        uVar13 = uVar18;
        for (uVar12 = uVar12 >> sVar16; (uVar12 >> 0x10 & 1) != 0;
            uVar12 = uVar12 >> (sbyte)(uVar17 & 0xf)) {
          uVar17 = (int)uVar13 + iVar15;
          uVar12 = 0;
          if (uVar9 <= uVar17) {
            uVar12 = uVar9;
          }
          uVar17 = uVar17 - uVar12;
          uVar13 = (ulong)uVar17;
          uVar12 = pmVar4[uVar17 >> 4];
          if ((uVar12 >> (uVar17 & 0xf) & 1) != 0) {
            uVar1 = (pmVar2->p[uVar13]->key).id_len;
            if ((uVar1 == (ppaVar3[uVar20]->key).id_len) &&
               (iVar11 = bcmp((pmVar2->p[uVar13]->key).id,(ppaVar3[uVar20]->key).id,(ulong)uVar1),
               iVar11 == 0)) {
              uVar18 = (ulong)uVar17;
              break;
            }
          }
        }
LAB_0011470c:
        pmVar2->p[uVar18] = h->p[uVar20];
        pmVar2->b[uVar18 >> 4] = pmVar2->b[uVar18 >> 4] | 1 << ((byte)uVar18 & 0xf);
        pmVar2->n_dirty = pmVar2->n_dirty + 1;
        uVar9 = h->n_buckets;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar9);
  }
  tnt_mem_free(h->p);
  tnt_mem_free(h->b);
  pmVar2->size = h->size;
  ppaVar3 = pmVar2->p;
  pmVar4 = pmVar2->b;
  mVar14 = pmVar2->resize_cnt;
  mVar7 = pmVar2->resize_position;
  mVar8 = pmVar2->batch;
  h->prime = pmVar2->prime;
  h->resize_cnt = mVar14;
  h->resize_position = mVar7;
  h->batch = mVar8;
  h->shadow = pmVar2->shadow;
  h->p = ppaVar3;
  h->b = pmVar4;
  mVar14 = pmVar2->n_dirty;
  mVar7 = pmVar2->size;
  mVar8 = pmVar2->upper_bound;
  h->n_buckets = pmVar2->n_buckets;
  h->n_dirty = mVar14;
  h->size = mVar7;
  h->upper_bound = mVar8;
  h->resize_cnt = h->resize_cnt + 1;
  return;
}

Assistant:

void
_mh(resize)(struct _mh(t) *h,
	    mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
#if MH_INCREMENTAL_RESIZE
	mh_int_t  batch = h->batch;
#endif
	mh_int_t i = 0;
	for (i = h->resize_position; i < h->n_buckets; i++) {
#if MH_INCREMENTAL_RESIZE
		if (batch-- == 0) {
			h->resize_position = i;
			return;
		}
#endif
		if (!mh_exist(h, i))
			continue;
		mh_int_t n = put_slot(s, mh_node(h, i), arg);
		s->p[n] = h->p[i];
		mh_setexist(s, n);
		s->n_dirty++;
	}
	MH_FREE(h->p);
	MH_FREE(h->b);
	s->size = h->size;
	memcpy(h, s, sizeof(*h));
	h->resize_cnt++;
}